

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall CInput::HandleJoystickButtonEvent(CInput *this,SDL_Event *Event)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  int iStack_20;
  
  iVar2 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if (((CONCAT44(extraout_var,iVar2) != 0) &&
      (*(Uint32 *)(CONCAT44(extraout_var,iVar2) + 0x78) == (Event->display).display)) &&
     (bVar1 = (Event->display).event, uVar3 = (ulong)bVar1, uVar3 < 0xc)) {
    if (Event->type == 0x604) {
      this->m_aInputState[uVar3 + 0x1a6] = false;
      iStack_20 = 2;
    }
    else {
      if (Event->type != 0x603) {
        return;
      }
      this->m_aInputState[uVar3 + 0x1a6] = true;
      this->m_aInputCount[uVar3 + 0x1a6] = (unsigned_short)this->m_InputCounter;
      iStack_20 = 1;
    }
    AddEvent(this,(char *)0x0,bVar1 + 0x1a6,iStack_20);
    return;
  }
  return;
}

Assistant:

void CInput::HandleJoystickButtonEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jbutton.which)
		return;
	if(Event.jbutton.button >= NUM_JOYSTICK_BUTTONS)
		return;

	const int Key = Event.jbutton.button + KEY_JOYSTICK_BUTTON_0;

	if(Event.type == SDL_JOYBUTTONDOWN)
	{
		m_aInputState[Key] = true;
		m_aInputCount[Key] = m_InputCounter;
		AddEvent(0, Key, IInput::FLAG_PRESS);
	}
	else if(Event.type == SDL_JOYBUTTONUP)
	{
		m_aInputState[Key] = false;
		AddEvent(0, Key, IInput::FLAG_RELEASE);
	}
}